

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::sessionFixtureSetTargetMsgSeqNumHelper::RunImpl
          (sessionFixtureSetTargetMsgSeqNumHelper *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  MessageStore *pMVar2;
  TestDetails **ppTVar3;
  TestDetails local_48;
  int local_28 [5];
  int local_14;
  sessionFixtureSetTargetMsgSeqNumHelper *psStack_10;
  int expectedMessageSeq;
  sessionFixtureSetTargetMsgSeqNumHelper *this_local;
  
  psStack_10 = this;
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0xffffffff);
  local_14 = 0x19;
  FIX::Session::setNextTargetMsgSeqNum((this->super_sessionFixture).object,0x19);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  pMVar2 = FIX::Session::getStore((this->super_sessionFixture).object);
  local_28[0] = (*pMVar2->_vptr_MessageStore[5])();
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_48,*ppTVar3,0x645);
  UnitTest::CheckEqual<int,int>(results,&local_14,local_28,&local_48);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SetTargetMsgSeqNum) {
  createSession(1);
  int expectedMessageSeq = 25;
  object->setNextTargetMsgSeqNum(expectedMessageSeq);
  CHECK_EQUAL(expectedMessageSeq, object->getStore()->getNextTargetMsgSeqNum());
}